

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

int Ivy_TruthDecompose_rec(uint uTruth,Vec_Int_t *vTree)

{
  Vec_Int_t *p;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uCof1;
  uint uCof0;
  uint uTruthCof;
  int i;
  int fCompl;
  int RetValue;
  int nVars;
  int Count2;
  int Count1;
  int Count0;
  int nSupp;
  int *pVars;
  int Vars2 [5];
  int *local_78;
  int Vars1 [5];
  int *local_58;
  int Vars0 [5];
  uint local_38 [2];
  int Supp [5];
  Ivy_Dec_t local_1c;
  Vec_Int_t *pVStack_18;
  Ivy_Dec_t Node;
  Vec_Int_t *vTree_local;
  uint uTruth_local;
  
  Count1 = 0;
  RetValue = 0;
  nVars = 0;
  Count2 = 0;
  pVStack_18 = vTree;
  for (uCof0 = 0; (int)uCof0 < 5; uCof0 = uCof0 + 1) {
    iVar1 = Ivy_TruthCofactorIsConst(uTruth,uCof0,0,0);
    if (iVar1 == 0) {
      iVar1 = Ivy_TruthCofactorIsConst(uTruth,uCof0,1,0);
      if (iVar1 == 0) {
        iVar1 = Ivy_TruthCofactorIsConst(uTruth,uCof0,0,1);
        if (iVar1 == 0) {
          iVar1 = Ivy_TruthCofactorIsConst(uTruth,uCof0,1,1);
          if (iVar1 == 0) {
            uVar2 = Ivy_TruthCofactor(uTruth,uCof0 << 1 | 1);
            uVar3 = Ivy_TruthCofactor(uTruth,uCof0 << 1);
            if (uVar2 == (uVar3 ^ 0xffffffff)) {
              Vars2[(long)RetValue + -2] = uCof0 << 1;
              RetValue = RetValue + 1;
            }
            else if (uVar2 != uVar3) {
              Supp[(long)Count1 + -2] = uCof0;
              Count1 = Count1 + 1;
            }
          }
          else {
            Vars1[(long)nVars + -2] = uCof0 << 1 | 1;
            nVars = nVars + 1;
          }
        }
        else {
          Vars1[(long)nVars + -2] = uCof0 << 1;
          nVars = nVars + 1;
        }
      }
      else {
        *(uint *)((long)&local_58 + (long)Count2 * 4) = uCof0 << 1 | 1;
        Count2 = Count2 + 1;
      }
    }
    else {
      *(uint *)((long)&local_58 + (long)Count2 * 4) = uCof0 << 1;
      Count2 = Count2 + 1;
    }
  }
  if ((Count2 != 0) && (nVars != 0)) {
    __assert_fail("Count0 == 0 || Count1 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                  ,0xf8,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if ((Count2 != 0) && (RetValue != 0)) {
    __assert_fail("Count0 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                  ,0xf9,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if ((nVars != 0) && (RetValue != 0)) {
    __assert_fail("Count1 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                  ,0xfa,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if ((Count2 == 1) && (Count1 == 0)) {
    vTree_local._4_4_ = (uint)local_58;
  }
  else if ((Count2 == 0) && ((nVars == 0 && (RetValue == 0)))) {
    vTree_local._4_4_ = Ivy_TruthRecognizeMuxMaj(uTruth,(int *)local_38,Count1,pVStack_18);
  }
  else {
    Ivy_DecClear(&local_1c);
    vTree_local._0_4_ = uTruth;
    if (Count2 < 1) {
      if (nVars < 1) {
        if (RetValue < 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                        ,0x10d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
        }
        fCompl = RetValue;
        _Count0 = &pVars;
        local_1c = (Ivy_Dec_t)((uint)local_1c & 0xfffffff0 | 4);
        uTruthCof = 0;
      }
      else {
        fCompl = nVars;
        _Count0 = &local_78;
        local_1c = (Ivy_Dec_t)((uint)local_1c & 0xfffffff0 | 3);
        uTruthCof = 1;
        vTree_local._0_4_ = uTruth ^ 0xffffffff;
      }
    }
    else {
      fCompl = Count2;
      _Count0 = &local_58;
      local_1c = (Ivy_Dec_t)((uint)local_1c & 0xfffffff0 | 3);
      uTruthCof = 0;
    }
    local_1c = (Ivy_Dec_t)((uint)local_1c & 0xffffff1f | (fCompl + (uint)(0 < Count1) & 7) << 5);
    uCof1 = (uint)vTree_local;
    for (uCof0 = 0; (int)uCof0 < fCompl; uCof0 = uCof0 + 1) {
      uCof1 = Ivy_TruthCofactor(uCof1,*(int *)((long)_Count0 + (long)(int)uCof0 * 4));
      Ivy_DecSetVar(&local_1c,uCof0,*(uint *)((long)_Count0 + (long)(int)uCof0 * 4));
    }
    if (((uint)local_1c & 0xf) == 4) {
      uTruthCof = ((uint)local_1c >> 5 & 1) == 0 ^ uTruthCof;
    }
    if (Count1 < 1) {
      if (((uint)local_1c & 0xf) == 4) {
        uTruthCof = uCof1 == 0 ^ uTruthCof;
      }
    }
    else {
      if ((uCof1 == 0) || (uCof1 == 0xffffffff)) {
        __assert_fail("uTruthCof != 0 && ~uTruthCof != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x11d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
      }
      i = Ivy_TruthDecompose_rec(uCof1,pVStack_18);
      if (i == 0xffffffff) {
        return -1;
      }
      if ((((uint)local_1c & 0xf) == 4) && ((i & 1U) != 0)) {
        uTruthCof = uTruthCof ^ 1;
        i = i ^ 1;
      }
      Ivy_DecSetVar(&local_1c,fCompl,i);
    }
    p = pVStack_18;
    iVar1 = Ivy_DecToInt(local_1c);
    Vec_IntPush(p,iVar1);
    iVar1 = Vec_IntSize(pVStack_18);
    vTree_local._4_4_ = (iVar1 + -1) * 2 | uTruthCof;
  }
  return vTree_local._4_4_;
}

Assistant:

int Ivy_TruthDecompose_rec( unsigned uTruth, Vec_Int_t * vTree )
{
    Ivy_Dec_t Node;
    int Supp[5], Vars0[5], Vars1[5], Vars2[5], * pVars = NULL;
    int nSupp, Count0, Count1, Count2, nVars = 0, RetValue, fCompl = 0, i;
    unsigned uTruthCof, uCof0, uCof1;

    // get constant confactors
    Count0 = Count1 = Count2 = nSupp = 0;
    for ( i = 0; i < 5; i++ )
    {
        if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 0) )
            Vars0[Count0++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 0) )
            Vars0[Count0++] = (i << 1) | 1;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 1) )
            Vars1[Count1++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 1) )
            Vars1[Count1++] = (i << 1) | 1;
        else
        {
            uCof0 = Ivy_TruthCofactor( uTruth, (i << 1) | 1 );
            uCof1 = Ivy_TruthCofactor( uTruth, (i << 1) | 0 );
            if ( uCof0 == ~uCof1 )
                Vars2[Count2++] = (i << 1) | 0;
            else if ( uCof0 != uCof1 )
                Supp[nSupp++] = i;
        }
    }
    assert( Count0 == 0 || Count1 == 0 );
    assert( Count0 == 0 || Count2 == 0 );
    assert( Count1 == 0 || Count2 == 0 );

    // consider the case of a single variable
    if ( Count0 == 1 && nSupp == 0 )
        return Vars0[0];

    // consider more complex decompositions
    if ( Count0 == 0 && Count1 == 0 && Count2 == 0 )
        return Ivy_TruthRecognizeMuxMaj( uTruth, Supp, nSupp, vTree );

    // extract the nodes
    Ivy_DecClear( &Node );
    if ( Count0 > 0 )
        nVars = Count0, pVars = Vars0, Node.Type = IVY_DEC_AND,  fCompl = 0;
    else if ( Count1 > 0 )
        nVars = Count1, pVars = Vars1, Node.Type = IVY_DEC_AND,  fCompl = 1, uTruth = ~uTruth;
    else if ( Count2 > 0 )
        nVars = Count2, pVars = Vars2, Node.Type = IVY_DEC_EXOR, fCompl = 0;
    else 
        assert( 0 );
    Node.nFans = nVars+(nSupp>0);

    // compute cofactor
    uTruthCof = uTruth;
    for ( i = 0; i < nVars; i++ )
    {
        uTruthCof = Ivy_TruthCofactor( uTruthCof, pVars[i] );
        Ivy_DecSetVar( &Node, i, pVars[i] );
    }

    if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= ((Node.nFans & 1) == 0);

    if ( nSupp > 0 )
    {
        assert( uTruthCof != 0 && ~uTruthCof != 0 );
        // call recursively
        RetValue = Ivy_TruthDecompose_rec( uTruthCof, vTree );
        // quit if non-decomposable
        if ( RetValue == -1 )
            return -1;
        // remove the complement from the child if the node is EXOR
        if ( Node.Type == IVY_DEC_EXOR && (RetValue & 1) )
        {
            fCompl ^= 1;
            RetValue ^= 1;
        }
        // set the new decomposition
        Ivy_DecSetVar( &Node, nVars, RetValue );
    }
    else if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= (uTruthCof == 0);

    Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    return ((Vec_IntSize(vTree)-1) << 1) | fCompl;
}